

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall
wallet::CreateWallet
          (wallet *this,WalletContext *context,string *name,optional<bool> load_on_start,
          DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  ulong uVar1;
  ArgsManager *this_00;
  size_type sVar2;
  Chain *pCVar3;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  string original_05;
  string original_06;
  string original_07;
  string original_08;
  bilingual_str lhs;
  bilingual_str lhs_00;
  bilingual_str lhs_01;
  bilingual_str lhs_02;
  bool bVar4;
  char cVar5;
  ArgsManager **ppAVar6;
  _Optional_payload_base<wallet::DatabaseFormat> _Var7;
  undefined4 uVar8;
  undefined6 in_register_0000000a;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  string *psVar10;
  ulong wallet_creation_flags;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar11;
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  undefined8 in_stack_fffffffffffffca8;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *pvVar12;
  _Optional_payload_base<bool> load_on_startup;
  undefined4 in_stack_fffffffffffffccc;
  undefined8 in_stack_fffffffffffffcd0;
  long *plVar13;
  undefined8 uVar14;
  WalletStorage in_stack_fffffffffffffcd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffce0;
  long *local_310;
  unique_lock<std::recursive_mutex> local_308;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  bilingual_str local_258;
  bilingual_str local_218;
  string local_1d8 [32];
  bilingual_str local_1b8;
  string local_178 [32];
  bilingual_str local_158;
  bilingual_str local_118;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  bilingual_str local_78;
  size_t local_38;
  
  uVar8 = (undefined4)
          CONCAT62(in_register_0000000a,
                   load_on_start.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool>);
  local_38 = *(size_t *)(in_FS_OFFSET + 0x28);
  uVar1 = options->create_flags;
  ppAVar6 = inline_assertion_check<true,ArgsManager*&>
                      (&context->args,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                       ,0x184,"CreateWallet","context.args");
  if ((uVar1 >> 0x22 & 1) == 0) {
    this_00 = *ppAVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-swapbdbendian",(allocator<char> *)&local_1b8);
    bVar4 = ArgsManager::GetBoolArg(this_00,&local_78.original,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar4) {
      _Var7._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x3;
      _Var7._M_engaged = true;
      _Var7._5_3_ = 0;
      goto LAB_0098bd4b;
    }
  }
  else {
    _Var7._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x1;
    _Var7._M_engaged = true;
    _Var7._5_3_ = 0;
LAB_0098bd4b:
    (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::DatabaseFormat> = _Var7;
  }
  sVar2 = (options->create_passphrase)._M_string_length;
  wallet_creation_flags = uVar1 | 0x200000000;
  if (sVar2 == 0) {
    wallet_creation_flags = uVar1;
  }
  if ((wallet_creation_flags & 0x900000000) == 0x800000000) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_98,"Private keys must be disabled when using an external signer",
               (allocator<char> *)&local_1b8);
    original._M_string_length = (size_type)status;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
    original.field_2._M_allocated_capacity = (size_type)this;
    original.field_2._8_8_ = name;
    Untranslated(&local_78,original);
    bilingual_str::operator=(error,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    psVar10 = local_98;
  }
  else if ((wallet_creation_flags & 0xc00000000) == 0x800000000) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"Descriptor support must be enabled when using an external signer",
               (allocator<char> *)&local_1b8);
    original_00._M_string_length = (size_type)status;
    original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
    original_00.field_2._M_allocated_capacity = (size_type)this;
    original_00.field_2._8_8_ = name;
    Untranslated(&local_78,original_00);
    bilingual_str::operator=(error,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    psVar10 = local_b8;
  }
  else {
    if (sVar2 == 0 || (wallet_creation_flags & 0x100000000) == 0) {
      MakeWalletDatabase((wallet *)&local_310,name,options,status,error);
      if (local_310 == (long *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_178,"Wallet file verification failed.",
                   (allocator<char> *)&stack0xfffffffffffffcd8);
        original_02._M_string_length = (size_type)status;
        original_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
        original_02.field_2._M_allocated_capacity = (size_type)this;
        original_02.field_2._8_8_ = name;
        Untranslated(&local_158,original_02);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1d8," ",(allocator<char> *)&local_308);
        original_03._M_string_length = (size_type)status;
        original_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
        original_03.field_2._M_allocated_capacity = (size_type)this;
        original_03.field_2._8_8_ = name;
        Untranslated(&local_1b8,original_03);
        lhs.original._M_string_length = (size_type)status;
        lhs.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
        lhs.original.field_2._M_allocated_capacity = (size_type)this;
        lhs.original.field_2._8_8_ = name;
        lhs.translated._M_dataplus._M_p._0_4_ = uVar8;
        lhs.translated._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffccc;
        lhs.translated._M_string_length = in_stack_fffffffffffffcd0;
        lhs.translated.field_2._M_allocated_capacity =
             (size_type)in_stack_fffffffffffffcd8._vptr_WalletStorage;
        lhs.translated.field_2._8_8_ = in_stack_fffffffffffffce0._M_pi;
        ::operator+(&local_118,lhs,&local_158);
        lhs_00.original._M_string_length = (size_type)status;
        lhs_00.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
        lhs_00.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_00.original.field_2._8_8_ = name;
        lhs_00.translated._M_dataplus._M_p._0_4_ = uVar8;
        lhs_00.translated._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffccc;
        lhs_00.translated._M_string_length = in_stack_fffffffffffffcd0;
        lhs_00.translated.field_2._M_allocated_capacity =
             (size_type)in_stack_fffffffffffffcd8._vptr_WalletStorage;
        lhs_00.translated.field_2._8_8_ = in_stack_fffffffffffffce0._M_pi;
        ::operator+(&local_78,lhs_00,&local_118);
        bilingual_str::operator=(error,&local_78);
        bilingual_str::~bilingual_str(&local_78);
        bilingual_str::~bilingual_str(&local_118);
        bilingual_str::~bilingual_str(&local_1b8);
        std::__cxx11::string::~string(local_1d8);
        bilingual_str::~bilingual_str(&local_158);
        std::__cxx11::string::~string(local_178);
        *status = FAILED_VERIFY;
        (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
        (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
        _Var9._M_pi = extraout_RDX_00;
      }
      else {
        pCVar3 = context->chain;
        _(&local_78,(ConstevalStringLiteral)0xdf92e3);
        (*pCVar3->_vptr_Chain[0x25])(pCVar3,&local_78.translated);
        bilingual_str::~bilingual_str(&local_78);
        plVar13 = local_310;
        local_310 = (long *)0x0;
        pvVar12 = warnings;
        CWallet::Create((CWallet *)&stack0xfffffffffffffcd8,context,name,
                        (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         )&stack0xfffffffffffffcd0,wallet_creation_flags,error,warnings);
        if (plVar13 != (long *)0x0) {
          (**(code **)(*plVar13 + 8))();
        }
        uVar14 = 0;
        if ((CWallet *)in_stack_fffffffffffffcd8._vptr_WalletStorage == (CWallet *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_278,"Wallet creation failed.",(allocator<char> *)&local_308);
          original_04._M_string_length = (size_type)status;
          original_04._M_dataplus._M_p = (pointer)pvVar12;
          original_04.field_2._M_allocated_capacity = (size_type)this;
          original_04.field_2._8_8_ = name;
          Untranslated(&local_258,original_04);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_298," ",(allocator<char> *)&stack0xfffffffffffffccf);
          original_05._M_string_length = (size_type)status;
          original_05._M_dataplus._M_p = (pointer)pvVar12;
          original_05.field_2._M_allocated_capacity = (size_type)this;
          original_05.field_2._8_8_ = name;
          Untranslated(&local_1b8,original_05);
          lhs_01.original._M_string_length = (size_type)status;
          lhs_01.original._M_dataplus._M_p = (pointer)pvVar12;
          lhs_01.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_01.original.field_2._8_8_ = name;
          lhs_01.translated._M_dataplus._M_p._0_4_ = uVar8;
          lhs_01.translated._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffccc;
          lhs_01.translated._M_string_length = uVar14;
          lhs_01.translated.field_2._M_allocated_capacity =
               (size_type)in_stack_fffffffffffffcd8._vptr_WalletStorage;
          lhs_01.translated.field_2._8_8_ = in_stack_fffffffffffffce0._M_pi;
          ::operator+(&local_218,lhs_01,&local_258);
          lhs_02.original._M_string_length = (size_type)status;
          lhs_02.original._M_dataplus._M_p = (pointer)pvVar12;
          lhs_02.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_02.original.field_2._8_8_ = name;
          lhs_02.translated._M_dataplus._M_p._0_4_ = uVar8;
          lhs_02.translated._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffccc;
          lhs_02.translated._M_string_length = uVar14;
          lhs_02.translated.field_2._M_allocated_capacity =
               (size_type)in_stack_fffffffffffffcd8._vptr_WalletStorage;
          lhs_02.translated.field_2._8_8_ = in_stack_fffffffffffffce0._M_pi;
          ::operator+(&local_78,lhs_02,&local_218);
          bilingual_str::operator=(error,&local_78);
          bilingual_str::~bilingual_str(&local_78);
          bilingual_str::~bilingual_str(&local_218);
          bilingual_str::~bilingual_str(&local_1b8);
          std::__cxx11::string::~string(local_298);
          bilingual_str::~bilingual_str(&local_258);
          std::__cxx11::string::~string(local_278);
          *status = FAILED_CREATE;
LAB_0098c31b:
          (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
          (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
        }
        else {
          if (((wallet_creation_flags & 0x100000000) == 0) &&
             ((options->create_passphrase)._M_string_length != 0)) {
            bVar4 = CWallet::EncryptWallet
                              ((CWallet *)in_stack_fffffffffffffcd8._vptr_WalletStorage,
                               &options->create_passphrase);
            if (!bVar4) {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2b8,"Error: Wallet created but failed to encrypt.",
                         (allocator<char> *)&local_1b8);
              original_06._M_string_length = (size_type)status;
              original_06._M_dataplus._M_p = (pointer)pvVar12;
              original_06.field_2._M_allocated_capacity = (size_type)this;
              original_06.field_2._8_8_ = name;
              Untranslated(&local_78,original_06);
              bilingual_str::operator=(error,&local_78);
              bilingual_str::~bilingual_str(&local_78);
              psVar10 = local_2b8;
LAB_0098c30b:
              std::__cxx11::string::~string(psVar10);
              *status = FAILED_ENCRYPT;
              goto LAB_0098c31b;
            }
            if ((uVar1 & 0x200000000) == 0) {
              bVar4 = CWallet::Unlock((CWallet *)in_stack_fffffffffffffcd8._vptr_WalletStorage,
                                      &options->create_passphrase);
              if (!bVar4) {
                std::__cxx11::string::string<std::allocator<char>>
                          (local_2d8,"Error: Wallet was encrypted but could not be unlocked",
                           (allocator<char> *)&local_1b8);
                original_07._M_string_length = (size_type)status;
                original_07._M_dataplus._M_p = (pointer)pvVar12;
                original_07.field_2._M_allocated_capacity = (size_type)this;
                original_07.field_2._8_8_ = name;
                Untranslated(&local_78,original_07);
                bilingual_str::operator=(error,&local_78);
                bilingual_str::~bilingual_str(&local_78);
                psVar10 = local_2d8;
                goto LAB_0098c30b;
              }
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_308,
                         (RecursiveMutex *)(in_stack_fffffffffffffcd8._vptr_WalletStorage + 0x3d),
                         "wallet->cs_wallet",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                         ,0x1ca,false);
              if (((((atomic<unsigned_long> *)(in_stack_fffffffffffffcd8._vptr_WalletStorage + 0x16)
                    )->super___atomic_base<unsigned_long>)._M_i & 0x400000000) == 0) {
                CWallet::GetActiveScriptPubKeyMans
                          ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                            *)&local_1b8,(CWallet *)in_stack_fffffffffffffcd8._vptr_WalletStorage);
                for (uVar14 = local_1b8.original.field_2._8_8_;
                    (size_type *)uVar14 != &local_1b8.original._M_string_length;
                    uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14)) {
                  cVar5 = (**(code **)(**(long **)(uVar14 + 0x20) + 0x58))
                                    (*(long **)(uVar14 + 0x20),0);
                  if (cVar5 == '\0') {
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_2f8,"Unable to generate initial keys",
                               (allocator<char> *)&stack0xfffffffffffffccf);
                    original_08._M_string_length = (size_type)status;
                    original_08._M_dataplus._M_p = (pointer)pvVar12;
                    original_08.field_2._M_allocated_capacity = (size_type)this;
                    original_08.field_2._8_8_ = name;
                    Untranslated(&local_78,original_08);
                    bilingual_str::operator=(error,&local_78);
                    bilingual_str::~bilingual_str(&local_78);
                    std::__cxx11::string::~string(local_2f8);
                    *status = FAILED_CREATE;
                    (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage =
                         (_func_int **)0x0;
                    (((element_type *)this)->super_Notifications)._vptr_Notifications =
                         (_func_int **)0x0;
                    std::
                    _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                    ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                                 *)&local_1b8);
                    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_308);
                    goto LAB_0098c443;
                  }
                }
                std::
                _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                             *)&local_1b8);
              }
              else {
                CWallet::SetupDescriptorScriptPubKeyMans
                          ((CWallet *)in_stack_fffffffffffffcd8._vptr_WalletStorage);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_308);
              CWallet::Lock((CWallet *)in_stack_fffffffffffffcd8._vptr_WalletStorage);
            }
          }
          load_on_startup = SUB42(uVar8,0);
          NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)&stack0xfffffffffffffcd8);
          AddWallet(context,(shared_ptr<wallet::CWallet> *)&stack0xfffffffffffffcd8);
          CWallet::postInitProcess((CWallet *)in_stack_fffffffffffffcd8._vptr_WalletStorage);
          UpdateWalletSetting(context->chain,name,(optional<bool>)load_on_startup,warnings);
          if ((wallet_creation_flags & 0x400000000) == 0) {
            _(&local_78,(ConstevalStringLiteral)0xe06234);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (warnings,&local_78);
            bilingual_str::~bilingual_str(&local_78);
          }
          *status = SUCCESS;
          (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage =
               in_stack_fffffffffffffcd8._vptr_WalletStorage;
          (((element_type *)this)->super_Notifications)._vptr_Notifications =
               (_func_int **)in_stack_fffffffffffffce0._M_pi;
        }
LAB_0098c443:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffce0);
        _Var9._M_pi = extraout_RDX_01;
      }
      if (local_310 != (long *)0x0) {
        (**(code **)(*local_310 + 8))();
        _Var9._M_pi = extraout_RDX_02;
      }
      goto LAB_0098c07c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_d8,
               "Passphrase provided but private keys are disabled. A passphrase is only used to encrypt private keys, so cannot be used for wallets with private keys disabled."
               ,(allocator<char> *)&local_1b8);
    original_01._M_string_length = (size_type)status;
    original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca8;
    original_01.field_2._M_allocated_capacity = (size_type)this;
    original_01.field_2._8_8_ = name;
    Untranslated(&local_78,original_01);
    bilingual_str::operator=(error,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    psVar10 = local_d8;
  }
  std::__cxx11::string::~string(psVar10);
  *status = FAILED_CREATE;
  (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
  (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
  _Var9._M_pi = extraout_RDX;
LAB_0098c07c:
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar11.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var9._M_pi;
    sVar11.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar11.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> CreateWallet(WalletContext& context, const std::string& name, std::optional<bool> load_on_start, DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    uint64_t wallet_creation_flags = options.create_flags;
    const SecureString& passphrase = options.create_passphrase;

    ArgsManager& args = *Assert(context.args);

    if (wallet_creation_flags & WALLET_FLAG_DESCRIPTORS) options.require_format = DatabaseFormat::SQLITE;
    else if (args.GetBoolArg("-swapbdbendian", false)) {
        options.require_format = DatabaseFormat::BERKELEY_SWAP;
    }

    // Indicate that the wallet is actually supposed to be blank and not just blank to make it encrypted
    bool create_blank = (wallet_creation_flags & WALLET_FLAG_BLANK_WALLET);

    // Born encrypted wallets need to be created blank first.
    if (!passphrase.empty()) {
        wallet_creation_flags |= WALLET_FLAG_BLANK_WALLET;
    }

    // Private keys must be disabled for an external signer wallet
    if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) && !(wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        error = Untranslated("Private keys must be disabled when using an external signer");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Descriptor support must be enabled for an external signer wallet
    if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) && !(wallet_creation_flags & WALLET_FLAG_DESCRIPTORS)) {
        error = Untranslated("Descriptor support must be enabled when using an external signer");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Do not allow a passphrase when private keys are disabled
    if (!passphrase.empty() && (wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        error = Untranslated("Passphrase provided but private keys are disabled. A passphrase is only used to encrypt private keys, so cannot be used for wallets with private keys disabled.");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Wallet::Verify will check if we're trying to create a wallet with a duplicate name.
    std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(name, options, status, error);
    if (!database) {
        error = Untranslated("Wallet file verification failed.") + Untranslated(" ") + error;
        status = DatabaseStatus::FAILED_VERIFY;
        return nullptr;
    }

    // Make the wallet
    context.chain->initMessage(_("Loading wallet…").translated);
    std::shared_ptr<CWallet> wallet = CWallet::Create(context, name, std::move(database), wallet_creation_flags, error, warnings);
    if (!wallet) {
        error = Untranslated("Wallet creation failed.") + Untranslated(" ") + error;
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Encrypt the wallet
    if (!passphrase.empty() && !(wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        if (!wallet->EncryptWallet(passphrase)) {
            error = Untranslated("Error: Wallet created but failed to encrypt.");
            status = DatabaseStatus::FAILED_ENCRYPT;
            return nullptr;
        }
        if (!create_blank) {
            // Unlock the wallet
            if (!wallet->Unlock(passphrase)) {
                error = Untranslated("Error: Wallet was encrypted but could not be unlocked");
                status = DatabaseStatus::FAILED_ENCRYPT;
                return nullptr;
            }

            // Set a seed for the wallet
            {
                LOCK(wallet->cs_wallet);
                if (wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                    wallet->SetupDescriptorScriptPubKeyMans();
                } else {
                    for (auto spk_man : wallet->GetActiveScriptPubKeyMans()) {
                        if (!spk_man->SetupGeneration()) {
                            error = Untranslated("Unable to generate initial keys");
                            status = DatabaseStatus::FAILED_CREATE;
                            return nullptr;
                        }
                    }
                }
            }

            // Relock the wallet
            wallet->Lock();
        }
    }

    NotifyWalletLoaded(context, wallet);
    AddWallet(context, wallet);
    wallet->postInitProcess();

    // Write the wallet settings
    UpdateWalletSetting(*context.chain, name, load_on_start, warnings);

    // Legacy wallets are being deprecated, warn if a newly created wallet is legacy
    if (!(wallet_creation_flags & WALLET_FLAG_DESCRIPTORS)) {
        warnings.push_back(_("Wallet created successfully. The legacy wallet type is being deprecated and support for creating and opening legacy wallets will be removed in the future."));
    }

    status = DatabaseStatus::SUCCESS;
    return wallet;
}